

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

void int_rel(IntVar *x,IntRelType t,IntVar *y,int c)

{
  FILE *pFVar1;
  char *pcVar2;
  int in_ECX;
  IntVar *in_RDX;
  undefined4 in_ESI;
  IntVar *in_RDI;
  BoolView *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  IntView<0> in_stack_00000018;
  vec<IntVar_*> vars;
  vec<int> coeffs;
  BoolView *in_stack_00000280;
  IntView<0> in_stack_00000288;
  IntView<0> in_stack_00000298;
  undefined2 in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffeb2;
  IntVar **in_stack_fffffffffffffeb8;
  undefined2 in_stack_fffffffffffffec0;
  undefined6 in_stack_fffffffffffffec2;
  char *local_138;
  char *local_120;
  vec<IntVar_*> local_e0;
  longdouble in_stack_ffffffffffffff30;
  longdouble in_stack_ffffffffffffff40;
  IntVar *in_stack_ffffffffffffff50;
  vec<int> *in_stack_ffffffffffffff58;
  MIP *in_stack_ffffffffffffff60;
  IntView<0> local_90;
  IntView<0> local_80;
  IntView<0> local_70;
  IntView<0> local_60;
  IntView<0> local_50;
  IntView<0> local_40;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  pFVar1 = _stderr;
  switch(in_ESI) {
  case 0:
    int_rel((IntVar *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(IntRelType)((ulong)in_RDX >> 0x20)
            ,(IntVar *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    int_rel((IntVar *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(IntRelType)((ulong)in_RDX >> 0x20)
            ,(IntVar *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    break;
  case 1:
    IntView<0>::IntView((IntView<0> *)&stack0xffffffffffffffd0,in_RDI,1,0);
    IntView<0>::IntView(&local_40,in_RDX,1,in_ECX);
    newBinNE(in_stack_00000018,(IntView<0>)in_stack_00000008,unaff_retaddr);
    break;
  case 2:
    IntView<0>::IntView(&local_50,in_RDX,1,0);
    IntView<0>::IntView(&local_60,in_RDI,1,-in_ECX);
    newBinGE(in_stack_00000298,in_stack_00000288,in_stack_00000280);
    break;
  case 3:
    IntView<0>::IntView(&local_70,in_RDX,1,0);
    IntView<0>::IntView(&local_80,in_RDI,1,1 - in_ECX);
    newBinGE(in_stack_00000298,in_stack_00000288,in_stack_00000280);
    break;
  case 4:
    IntView<0>::IntView(&local_90,in_RDI,1,0);
    IntView<0>::IntView((IntView<0> *)&stack0xffffffffffffff60,in_RDX,1,in_ECX);
    newBinGE(in_stack_00000298,in_stack_00000288,in_stack_00000280);
    break;
  case 5:
    IntView<0>::IntView((IntView<0> *)&stack0xffffffffffffff50,in_RDI,1,0);
    IntView<0>::IntView((IntView<0> *)&stack0xffffffffffffff40,in_RDX,1,in_ECX + 1);
    newBinGE(in_stack_00000298,in_stack_00000288,in_stack_00000280);
    break;
  default:
    pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      local_120 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
      ;
    }
    else {
      local_120 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                          ,0x2f);
      local_120 = local_120 + 1;
    }
    fprintf(pFVar1,"%s:%d: ",local_120,0x132);
    fprintf(_stderr,"Assertion failed.\n");
    abort();
  }
  vec<int>::vec((vec<int> *)&stack0xffffffffffffff30);
  vec<IntVar_*>::vec(&local_e0);
  vec<int>::push((vec<int> *)CONCAT62(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0),
                 (int *)in_stack_fffffffffffffeb8);
  vec<int>::push((vec<int> *)CONCAT62(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0),
                 (int *)in_stack_fffffffffffffeb8);
  vec<IntVar_*>::push((vec<IntVar_*> *)CONCAT62(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0)
                      ,in_stack_fffffffffffffeb8);
  vec<IntVar_*>::push((vec<IntVar_*> *)CONCAT62(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0)
                      ,in_stack_fffffffffffffeb8);
  pFVar1 = _stderr;
  switch(in_ESI) {
  case 0:
  case 1:
    break;
  case 2:
    in_stack_fffffffffffffeb0 = (undefined2)((unkuint10)(longdouble)-1e+100 >> 0x40);
    MIP::addConstraint(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       (vec<IntVar_*> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff40,
                       in_stack_ffffffffffffff30);
    break;
  case 3:
    in_stack_fffffffffffffeb0 = (undefined2)((unkuint10)(longdouble)-1e+100 >> 0x40);
    MIP::addConstraint(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       (vec<IntVar_*> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff40,
                       in_stack_ffffffffffffff30);
    break;
  case 4:
    in_stack_fffffffffffffeb0 = (undefined2)((unkuint10)(longdouble)in_ECX >> 0x40);
    MIP::addConstraint(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       (vec<IntVar_*> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff40,
                       in_stack_ffffffffffffff30);
    break;
  case 5:
    in_stack_fffffffffffffeb0 = (undefined2)((unkuint10)(longdouble)(in_ECX + 1) >> 0x40);
    MIP::addConstraint(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       (vec<IntVar_*> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff40,
                       in_stack_ffffffffffffff30);
    break;
  default:
    pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      local_138 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
      ;
    }
    else {
      local_138 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                          ,0x2f);
      local_138 = local_138 + 1;
    }
    fprintf(pFVar1,"%s:%d: ",local_138,0x14e);
    fprintf(_stderr,"Assertion failed.\n");
    abort();
  }
  vec<IntVar_*>::~vec((vec<IntVar_*> *)CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0)
                     );
  vec<int>::~vec((vec<int> *)CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0));
  return;
}

Assistant:

void int_rel(IntVar* x, IntRelType t, IntVar* y, int c) {
	switch (t) {
		case IRT_EQ:
			int_rel(x, IRT_LE, y, c);
			int_rel(x, IRT_GE, y, c);
			break;
		case IRT_NE:
			newBinNE(IntView<>(x), IntView<>(y, 1, c));
			break;
		case IRT_LE:
			// a <= b <=> b >= a
			newBinGE(IntView<>(y), IntView<>(x, 1, -c));
			break;
		case IRT_LT:
			// a < b <=> b >= (a+1)
			newBinGE(IntView<>(y), IntView<>(x, 1, 1 - c));
			break;
		case IRT_GE:
			// a >= b
			newBinGE(IntView<>(x), IntView<>(y, 1, c));
			break;
		case IRT_GT:
			// a > b <=> a >= (b+1)
			newBinGE(IntView<>(x), IntView<>(y, 1, 1 + c));
			break;
		default:
			NEVER;
	}

	vec<int> coeffs;
	vec<IntVar*> vars;

	coeffs.push(1);
	coeffs.push(-1);
	vars.push(x);
	vars.push(y);

	switch (t) {
		case IRT_EQ:
		case IRT_NE:
			break;
		case IRT_LE:
			mip->addConstraint(coeffs, vars, -1e100, c);
			break;
		case IRT_LT:
			mip->addConstraint(coeffs, vars, -1e100, c - 1);
			break;
		case IRT_GE:
			mip->addConstraint(coeffs, vars, c, 1e100);
			break;
		case IRT_GT:
			mip->addConstraint(coeffs, vars, c + 1, 1e100);
			break;
		default:
			NEVER;
	}
}